

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError AlsaStart(PaAlsaStream *stream,int priming)

{
  snd_pcm_t *psVar1;
  int iVar2;
  int iVar3;
  pthread_t pVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  snd_pcm_uframes_t offset;
  snd_pcm_uframes_t frames;
  snd_pcm_channel_area_t *areas;
  
  psVar1 = (stream->playback).pcm;
  if (psVar1 != (snd_pcm_t *)0x0) {
    iVar3 = stream->callbackMode;
    iVar2 = snd_pcm_prepare(psVar1,CONCAT44(in_register_00000034,priming));
    if (iVar3 == 0) {
      if (iVar2 < 0) {
        pVar4 = pthread_self();
        iVar3 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar3 != 0) {
          pcVar5 = (char *)snd_strerror(iVar2);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar5);
        }
        pcVar5 = 
        "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2923\n"
        ;
        goto LAB_00110915;
      }
    }
    else {
      if (iVar2 < 0) {
        pVar4 = pthread_self();
        iVar3 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar3 != 0) {
          pcVar5 = (char *)snd_strerror(iVar2);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar5);
        }
        pcVar5 = 
        "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2915\n"
        ;
        goto LAB_00110915;
      }
      if ((stream->playback).canMmap != 0) {
        frames = snd_pcm_avail_update((stream->playback).pcm);
        snd_pcm_mmap_begin((stream->playback).pcm,&areas,&offset,&frames);
        snd_pcm_areas_silence
                  (areas,offset,(stream->playback).numHostChannels,frames,
                   (stream->playback).nativeFormat);
        snd_pcm_mmap_commit((stream->playback).pcm,offset,frames);
        if (((stream->playback).canMmap != 0) &&
           (iVar3 = snd_pcm_start((stream->playback).pcm), iVar3 < 0)) {
          pVar4 = pthread_self();
          iVar2 = pthread_equal(pVar4,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar5 = (char *)snd_strerror(iVar3);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar3,pcVar5);
          }
          pcVar5 = 
          "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2920\n"
          ;
          goto LAB_00110915;
        }
      }
    }
  }
  if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
    return 0;
  }
  if (stream->pcmsSynced != 0) {
    return 0;
  }
  iVar3 = snd_pcm_prepare();
  if (iVar3 < 0) {
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar5 = (char *)snd_strerror(iVar3);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar3,pcVar5);
    }
    pcVar5 = 
    "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2927\n"
    ;
  }
  else {
    iVar3 = snd_pcm_start((stream->capture).pcm);
    if (-1 < iVar3) {
      return 0;
    }
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar5 = (char *)snd_strerror(iVar3);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar3,pcVar5);
    }
    pcVar5 = 
    "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2929\n"
    ;
  }
LAB_00110915:
  PaUtil_DebugPrint(pcVar5);
  return -9999;
}

Assistant:

static PaError AlsaStart( PaAlsaStream *stream, int priming )
{
    PaError result = paNoError;

    if( stream->playback.pcm )
    {
        if( stream->callbackMode )
        {
            if( !priming )
            {
                /* Buffer isn't primed, so prepare and silence */
                ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
                if( stream->playback.canMmap )
                    SilenceBuffer( stream );
            }
            if( stream->playback.canMmap )
                ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
        else
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
    }
    if( stream->capture.pcm && !stream->pcmsSynced )
    {
        ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );
        /* For a blocking stream we want to start capture as well, since nothing will happen otherwise */
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

end:
    return result;
error:
    goto end;
}